

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

ATTRIBUTE_ID * getAttributeId(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  KEY pXVar1;
  STRING_POOL *pool;
  XML_Char XVar2;
  DTD *pDVar3;
  XML_Bool XVar4;
  char cVar5;
  XML_Char *pXVar6;
  ATTRIBUTE_ID *pAVar7;
  XML_Char *pXVar8;
  PREFIX *pPVar9;
  long lVar10;
  long lVar11;
  
  pDVar3 = parser->m_dtd;
  pool = &pDVar3->pool;
  pXVar6 = (pDVar3->pool).ptr;
  if (pXVar6 == (pDVar3->pool).end) {
    XVar4 = poolGrow(pool);
    if (XVar4 == '\0') {
      return (ATTRIBUTE_ID *)0x0;
    }
    pXVar6 = (pDVar3->pool).ptr;
  }
  (pDVar3->pool).ptr = pXVar6 + 1;
  *pXVar6 = '\0';
  pXVar6 = poolStoreString(pool,enc,start,end);
  if (pXVar6 != (XML_Char *)0x0) {
    pXVar1 = pXVar6 + 1;
    pAVar7 = (ATTRIBUTE_ID *)lookup(parser,&pDVar3->attributeIds,pXVar1,0x18);
    if (pAVar7 != (ATTRIBUTE_ID *)0x0) {
      if (pAVar7->name != pXVar1) {
        (pDVar3->pool).ptr = (pDVar3->pool).start;
        return pAVar7;
      }
      (pDVar3->pool).start = (pDVar3->pool).ptr;
      if (parser->m_ns == '\0') {
        return pAVar7;
      }
      cVar5 = *pXVar1;
      if ((((cVar5 == 'x') && (pXVar6[2] == 'm')) && (pXVar6[3] == 'l')) &&
         ((pXVar6[4] == 'n' && (pXVar6[5] == 's')))) {
        if (pXVar6[6] == ':') {
          pPVar9 = (PREFIX *)lookup(parser,&pDVar3->prefixes,pXVar6 + 7,0x10);
LAB_00168c78:
          pAVar7->prefix = pPVar9;
          pAVar7->xmlns = '\x01';
          return pAVar7;
        }
        if (pXVar6[6] == '\0') {
          pPVar9 = &pDVar3->defaultPrefix;
          goto LAB_00168c78;
        }
      }
      lVar11 = 0;
      while( true ) {
        if (cVar5 == '\0') {
          return pAVar7;
        }
        if (cVar5 == ':') break;
        cVar5 = pXVar6[lVar11 + 2];
        lVar11 = lVar11 + 1;
      }
      lVar10 = 0;
      while( true ) {
        pXVar6 = (pDVar3->pool).end;
        pXVar8 = (pDVar3->pool).ptr;
        if (lVar11 == lVar10) break;
        if (pXVar8 == pXVar6) {
          XVar4 = poolGrow(pool);
          if (XVar4 == '\0') {
            return (ATTRIBUTE_ID *)0x0;
          }
          pXVar8 = (pDVar3->pool).ptr;
        }
        XVar2 = pXVar1[lVar10];
        (pDVar3->pool).ptr = pXVar8 + 1;
        *pXVar8 = XVar2;
        lVar10 = lVar10 + 1;
      }
      if (pXVar8 == pXVar6) {
        XVar4 = poolGrow(pool);
        if (XVar4 == '\0') {
          return (ATTRIBUTE_ID *)0x0;
        }
        pXVar8 = (pDVar3->pool).ptr;
      }
      (pDVar3->pool).ptr = pXVar8 + 1;
      *pXVar8 = '\0';
      pPVar9 = (PREFIX *)lookup(parser,&pDVar3->prefixes,(pDVar3->pool).start,0x10);
      pAVar7->prefix = pPVar9;
      if (pPVar9 != (PREFIX *)0x0) {
        pXVar1 = (pDVar3->pool).start;
        if (pPVar9->name == pXVar1) {
          (pDVar3->pool).start = (pDVar3->pool).ptr;
          return pAVar7;
        }
        (pDVar3->pool).ptr = pXVar1;
        return pAVar7;
      }
    }
  }
  return (ATTRIBUTE_ID *)0x0;
}

Assistant:

static ATTRIBUTE_ID *
getAttributeId(XML_Parser parser, const ENCODING *enc, const char *start,
               const char *end) {
  DTD *const dtd = parser->m_dtd; /* save one level of indirection */
  ATTRIBUTE_ID *id;
  const XML_Char *name;
  if (! poolAppendChar(&dtd->pool, XML_T('\0')))
    return NULL;
  name = poolStoreString(&dtd->pool, enc, start, end);
  if (! name)
    return NULL;
  /* skip quotation mark - its storage will be reused (like in name[-1]) */
  ++name;
  id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, name,
                              sizeof(ATTRIBUTE_ID));
  if (! id)
    return NULL;
  if (id->name != name)
    poolDiscard(&dtd->pool);
  else {
    poolFinish(&dtd->pool);
    if (! parser->m_ns)
      ;
    else if (name[0] == XML_T(ASCII_x) && name[1] == XML_T(ASCII_m)
             && name[2] == XML_T(ASCII_l) && name[3] == XML_T(ASCII_n)
             && name[4] == XML_T(ASCII_s)
             && (name[5] == XML_T('\0') || name[5] == XML_T(ASCII_COLON))) {
      if (name[5] == XML_T('\0'))
        id->prefix = &dtd->defaultPrefix;
      else
        id->prefix = (PREFIX *)lookup(parser, &dtd->prefixes, name + 6,
                                      sizeof(PREFIX));
      id->xmlns = XML_TRUE;
    } else {
      int i;
      for (i = 0; name[i]; i++) {
        /* attributes without prefix are *not* in the default namespace */
        if (name[i] == XML_T(ASCII_COLON)) {
          int j;
          for (j = 0; j < i; j++) {
            if (! poolAppendChar(&dtd->pool, name[j]))
              return NULL;
          }
          if (! poolAppendChar(&dtd->pool, XML_T('\0')))
            return NULL;
          id->prefix = (PREFIX *)lookup(parser, &dtd->prefixes,
                                        poolStart(&dtd->pool), sizeof(PREFIX));
          if (! id->prefix)
            return NULL;
          if (id->prefix->name == poolStart(&dtd->pool))
            poolFinish(&dtd->pool);
          else
            poolDiscard(&dtd->pool);
          break;
        }
      }
    }
  }
  return id;
}